

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,double *points,double *boxmin,
               double *boxmax,int bGrowBox)

{
  size_t __n;
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  
  lVar4 = 0;
  while ((lVar4 < dim && (bGrowBox != 0))) {
    if (boxmax[lVar4] <= boxmin[lVar4] && boxmin[lVar4] != boxmax[lVar4]) {
      bGrowBox = 0;
    }
    lVar4 = lVar4 + 1;
  }
  if (count < 1) {
    return bGrowBox != 0;
  }
  if ((dim < 1 || points == (double *)0x0) || ((count != 1 && (stride < (int)((uint)is_rat + dim))))
     ) {
    return false;
  }
  if (is_rat) {
    uVar5 = (ulong)(uint)dim;
    iVar6 = count + -1;
    bVar8 = true;
    while( true ) {
      iVar7 = iVar6 + 1;
      if (iVar7 < 1) {
        return bVar8;
      }
      dVar1 = points[uVar5];
      if ((dVar1 != 0.0) || (NAN(dVar1))) break;
      points = points + stride;
      iVar6 = iVar6 + -1;
      bVar8 = false;
    }
    if (bGrowBox == 0) {
      ON_ArrayScale(dim,1.0 / dVar1,points,boxmin);
      memcpy(boxmax,boxmin,uVar5 * 8);
      if (iVar6 == 0) {
        return bVar8;
      }
      points = points + stride;
      iVar7 = iVar6;
    }
    do {
      bVar9 = iVar7 == 0;
      iVar7 = iVar7 + -1;
      if (bVar9) {
        return bVar8;
      }
      dVar1 = points[uVar5];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        lVar3 = 0;
        for (lVar4 = 0; uVar5 << 3 != lVar4; lVar4 = lVar4 + 8) {
          dVar10 = *(double *)((long)points + lVar4) * (1.0 / dVar1);
          if (*(double *)((long)boxmin + lVar4) <= dVar10) {
            if (*(double *)((long)boxmax + lVar4) <= dVar10 &&
                dVar10 != *(double *)((long)boxmax + lVar4)) {
              pdVar2 = (double *)((long)boxmax + lVar4);
              goto LAB_0040bca7;
            }
          }
          else {
            pdVar2 = boxmin + lVar3;
LAB_0040bca7:
            *pdVar2 = dVar10;
          }
          lVar3 = lVar3 + 1;
        }
      }
      else {
        bVar8 = false;
      }
      points = points + stride;
    } while( true );
  }
  if (bGrowBox == 0) {
    __n = (ulong)(uint)dim * 8;
    memcpy(boxmin,points,__n);
    memmove(boxmax,points,__n);
    count = count + -1;
    if (count == 0) {
      return true;
    }
    points = points + stride;
  }
  do {
    bVar8 = count == 0;
    count = count + -1;
    if (bVar8) {
      return true;
    }
    lVar3 = 0;
    for (lVar4 = 0; (ulong)(uint)dim << 3 != lVar4; lVar4 = lVar4 + 8) {
      dVar1 = *(double *)((long)points + lVar4);
      if (*(double *)((long)boxmin + lVar4) <= dVar1) {
        if (*(double *)((long)boxmax + lVar4) <= dVar1 && dVar1 != *(double *)((long)boxmax + lVar4)
           ) {
          pdVar2 = (double *)((long)boxmax + lVar4);
          goto LAB_0040bbc7;
        }
      }
      else {
        pdVar2 = boxmin + lVar3;
LAB_0040bbc7:
        *pdVar2 = dVar1;
      }
      lVar3 = lVar3 + 1;
    }
    points = points + stride;
  } while( true );
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const double* points, 
    double* boxmin, double* boxmax,
    int bGrowBox
    )
/*****************************************************************************
Bounding Box of a set of points
 
INPUT:
  dim           ( >= 1 ) dimension of each point
  is_rat        ( true if points are rational )
  count         ( >= 1 ) number of points
  stride        ( >= (is_rat)?(dim+1):dim )
  points        array of dim*count doubles
  boxmin, boxmax      unused arrays of dim doubles
  bGrowBox       true if input box should be enlarged to contain points
										boxmin[i]>boxmax[i] for some i, represents an empty initial box
                 false if input box should be ignored bounding box of points
                       is returned
OUTPUT:
  boxmin, boxmax      diagonal corners of bounding box
*****************************************************************************/
{
  // OBSOLETE
  // bounding box workhorse
  double x, w;
  int j;
  bool rc = false;
  for ( j = 0; j < dim && bGrowBox; j++ )
  {
    if ( boxmin[j] > boxmax[j] )
      bGrowBox = false;
  }

  if ( count > 0 ) 
  {
    if ( is_rat )
    {
      is_rat = 1;
    }
    if ( points && dim > 0 && (count == 1 || stride >= dim+is_rat) ) 
    {
      // input is valid list of a least 1 point

      if ( is_rat ) 
      {
        // bounding box of homogeneous rational points
        rc = true;
        while ( count > 0 && points[dim] == 0.0 ) 
        {
          count--;
          points += stride;
          rc = false;
        }
        if ( count > 0 ) 
        {
          if ( !bGrowBox  )
          {
            ON_ArrayScale( dim, 1.0/points[dim], points, boxmin );
            memcpy( boxmax, boxmin, dim*sizeof(*boxmax) );
            points += stride;
            count--;
            bGrowBox = true;
          }
          if ( count > 0 ) 
          {
            for ( /*empty*/; count--; points += stride ) 
            {
              if ( points[dim] == 0.0 ) {
                rc = false;
                continue;
              }
              w = 1.0/points[dim];
              for ( j = 0; j < dim; j++ ) 
              {
                x = w*points[j];
                if (boxmin[j] > x) 
                  boxmin[j] = x; 
                else if (boxmax[j] < x) 
                  boxmax[j] = x;
              }
            }
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        rc = true;
        if ( !bGrowBox ) 
        {
          // use first point to initialize box 
          memcpy( boxmin, points, dim*sizeof(*boxmin) );
          memcpy( boxmax, boxmin, dim*sizeof(*boxmax) );
          points += stride;
          count--;
          bGrowBox = true;
        }
        if ( count ) 
        {
          // grow box to contain the rest of the points
          for ( /*empty*/; count--; points += stride ) 
          {
            for ( j = 0; j < dim; j++ ) 
            {
              x = points[j];
              if (boxmin[j] > x) 
                boxmin[j] = x; 
              else if (boxmax[j] < x) 
                boxmax[j] = x;
            }
          }
        }
      }
    }
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = true;
  }
  return rc;
}